

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_value.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::ArrayValueStats(duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  BaseStatistics *this_01;
  reference other;
  idx_t i;
  ulong __n;
  LogicalType LStack_98;
  BaseStatistics list_stats;
  
  this_00 = input->child_stats;
  LogicalType::LogicalType(&LStack_98,&(input->expr->super_Expression).return_type);
  ArrayStats::CreateEmpty(&list_stats,&LStack_98);
  LogicalType::~LogicalType(&LStack_98);
  this_01 = ArrayStats::GetChildStats(&list_stats);
  for (__n = 0; __n < (ulong)(((long)(this_00->
                                     super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                     ).
                                     super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_00->
                                    super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                    ).
                                    super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x58);
      __n = __n + 1) {
    other = vector<duckdb::BaseStatistics,_true>::get<true>(this_00,__n);
    BaseStatistics::Merge(this_01,other);
  }
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&list_stats);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> ArrayValueStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	auto list_stats = ArrayStats::CreateEmpty(expr.return_type);
	auto &list_child_stats = ArrayStats::GetChildStats(list_stats);
	for (idx_t i = 0; i < child_stats.size(); i++) {
		list_child_stats.Merge(child_stats[i]);
	}
	return list_stats.ToUnique();
}